

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O0

void BrotliOptimizeHuffmanCountsForRle(size_t length,uint32_t *counts,uint8_t *good_for_rle)

{
  bool bVar1;
  ulong local_90;
  size_t count;
  size_t k_1;
  size_t k;
  size_t step;
  uint32_t symbol;
  size_t zeros;
  ulong uStack_58;
  uint32_t smallest_nonzero;
  size_t nonzeros;
  size_t i;
  size_t streak_limit;
  size_t sum;
  size_t limit;
  size_t stride;
  size_t nonzero_count;
  uint8_t *good_for_rle_local;
  uint32_t *counts_local;
  size_t length_local;
  
  stride = 0;
  for (nonzeros = 0; nonzeros < length; nonzeros = nonzeros + 1) {
    if (counts[nonzeros] != 0) {
      stride = stride + 1;
    }
  }
  counts_local = (uint32_t *)length;
  if (0xf < stride) {
    while( true ) {
      bVar1 = false;
      if (counts_local != (uint32_t *)0x0) {
        bVar1 = counts[(long)counts_local + -1] == 0;
      }
      if (!bVar1) break;
      counts_local = (uint32_t *)((long)counts_local + -1);
    }
    if (counts_local != (uint32_t *)0x0) {
      uStack_58 = 0;
      zeros._4_4_ = 0x40000000;
      for (nonzeros = 0; nonzeros < counts_local; nonzeros = nonzeros + 1) {
        if ((counts[nonzeros] != 0) && (uStack_58 = uStack_58 + 1, counts[nonzeros] < zeros._4_4_))
        {
          zeros._4_4_ = counts[nonzeros];
        }
      }
      if (4 < uStack_58) {
        if ((zeros._4_4_ < 4) && ((long)counts_local - uStack_58 < 6)) {
          for (nonzeros = 1; nonzeros < (long)counts_local - 1U; nonzeros = nonzeros + 1) {
            if (((counts[nonzeros - 1] != 0) && (counts[nonzeros] == 0)) &&
               (counts[nonzeros + 1] != 0)) {
              counts[nonzeros] = 1;
            }
          }
        }
        if (0x1b < uStack_58) {
          memset(good_for_rle,0,(size_t)counts_local);
          step._4_4_ = *counts;
          k = 0;
          for (nonzeros = 0; nonzeros <= counts_local; nonzeros = nonzeros + 1) {
            if (((uint32_t *)nonzeros == counts_local) || (counts[nonzeros] != step._4_4_)) {
              if (((step._4_4_ == 0) && (4 < k)) || ((step._4_4_ != 0 && (6 < k)))) {
                for (k_1 = 0; k_1 < k; k_1 = k_1 + 1) {
                  good_for_rle[(nonzeros - k_1) + -1] = '\x01';
                }
              }
              k = 1;
              if ((uint32_t *)nonzeros != counts_local) {
                step._4_4_ = counts[nonzeros];
              }
            }
            else {
              k = k + 1;
            }
          }
          limit = 0;
          sum = (size_t)(((*counts + counts[1] + counts[2]) * 0x100) / 3 + 0x1a4);
          streak_limit = 0;
          for (nonzeros = 0; nonzeros <= counts_local; nonzeros = nonzeros + 1) {
            if (((((uint32_t *)nonzeros == counts_local) || (good_for_rle[nonzeros] != '\0')) ||
                ((nonzeros != 0 && (good_for_rle[nonzeros - 1] != '\0')))) ||
               (0x9af < ((counts[nonzeros] << 8) - sum) + 0x4d8)) {
              if ((3 < limit) || ((2 < limit && (streak_limit == 0)))) {
                local_90 = (streak_limit + (limit >> 1)) / limit;
                if (local_90 == 0) {
                  local_90 = 1;
                }
                if (streak_limit == 0) {
                  local_90._0_4_ = 0;
                }
                for (count = 0; count < limit; count = count + 1) {
                  counts[(nonzeros - count) + -1] = (uint32_t)local_90;
                }
              }
              limit = 0;
              streak_limit = 0;
              if (nonzeros < (long)counts_local - 2U) {
                sum = (size_t)(((counts[nonzeros] + counts[nonzeros + 1] + counts[nonzeros + 2]) *
                               0x100) / 3 + 0x1a4);
              }
              else if (nonzeros < counts_local) {
                sum = (size_t)(counts[nonzeros] << 8);
              }
              else {
                sum = 0;
              }
            }
            limit = limit + 1;
            if ((uint32_t *)nonzeros != counts_local) {
              streak_limit = counts[nonzeros] + streak_limit;
              if (3 < limit) {
                sum = (streak_limit * 0x100 + (limit >> 1)) / limit;
              }
              if (limit == 4) {
                sum = sum + 0x78;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void BrotliOptimizeHuffmanCountsForRle(size_t length, uint32_t* counts,
                                       uint8_t* good_for_rle) {
  size_t nonzero_count = 0;
  size_t stride;
  size_t limit;
  size_t sum;
  const size_t streak_limit = 1240;
  /* Let's make the Huffman code more compatible with RLE encoding. */
  size_t i;
  for (i = 0; i < length; i++) {
    if (counts[i]) {
      ++nonzero_count;
    }
  }
  if (nonzero_count < 16) {
    return;
  }
  while (length != 0 && counts[length - 1] == 0) {
    --length;
  }
  if (length == 0) {
    return;  /* All zeros. */
  }
  /* Now counts[0..length - 1] does not have trailing zeros. */
  {
    size_t nonzeros = 0;
    uint32_t smallest_nonzero = 1 << 30;
    for (i = 0; i < length; ++i) {
      if (counts[i] != 0) {
        ++nonzeros;
        if (smallest_nonzero > counts[i]) {
          smallest_nonzero = counts[i];
        }
      }
    }
    if (nonzeros < 5) {
      /* Small histogram will model it well. */
      return;
    }
    if (smallest_nonzero < 4) {
      size_t zeros = length - nonzeros;
      if (zeros < 6) {
        for (i = 1; i < length - 1; ++i) {
          if (counts[i - 1] != 0 && counts[i] == 0 && counts[i + 1] != 0) {
            counts[i] = 1;
          }
        }
      }
    }
    if (nonzeros < 28) {
      return;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
     with an RLE code. */
  memset(good_for_rle, 0, length);
  {
    /* Let's not spoil any of the existing good RLE codes.
       Mark any seq of 0's that is longer as 5 as a good_for_rle.
       Mark any seq of non-0's that is longer as 7 as a good_for_rle. */
    uint32_t symbol = counts[0];
    size_t step = 0;
    for (i = 0; i <= length; ++i) {
      if (i == length || counts[i] != symbol) {
        if ((symbol == 0 && step >= 5) ||
            (symbol != 0 && step >= 7)) {
          size_t k;
          for (k = 0; k < step; ++k) {
            good_for_rle[i - k - 1] = 1;
          }
        }
        step = 1;
        if (i != length) {
          symbol = counts[i];
        }
      } else {
        ++step;
      }
    }
  }
  /* 3) Let's replace those population counts that lead to more RLE codes.
     Math here is in 24.8 fixed point representation. */
  stride = 0;
  limit = 256 * (counts[0] + counts[1] + counts[2]) / 3 + 420;
  sum = 0;
  for (i = 0; i <= length; ++i) {
    if (i == length || good_for_rle[i] ||
        (i != 0 && good_for_rle[i - 1]) ||
        (256 * counts[i] - limit + streak_limit) >= 2 * streak_limit) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        size_t k;
        /* The stride must end, collapse what we have, if we have enough (4). */
        size_t count = (sum + stride / 2) / stride;
        if (count == 0) {
          count = 1;
        }
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
             that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = (uint32_t)count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 2) {
        /* All interesting strides have a count of at least 4, */
        /* at least when non-zeros. */
        limit = 256 * (counts[i] + counts[i + 1] + counts[i + 2]) / 3 + 420;
      } else if (i < length) {
        limit = 256 * counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
      if (stride >= 4) {
        limit = (256 * sum + stride / 2) / stride;
      }
      if (stride == 4) {
        limit += 120;
      }
    }
  }
}